

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O2

int Mio_CommandPrintProfile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  FILE *pFile;
  int iVar1;
  FILE *__s;
  void *pvVar2;
  Mio_Library_t *pLib;
  
  Abc_FrameReadOut(pAbc);
  __s = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"savh");
    if (0x15 < iVar1 - 0x61U) break;
  } while ((0x240001U >> (iVar1 - 0x61U & 0x1f) & 1) != 0);
  if (iVar1 == -1) {
    pvVar2 = Abc_FrameReadLibGen();
    pFile = _stdout;
    if (pvVar2 != (void *)0x0) {
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      Mio_LibraryWriteProfile(pFile,pLib);
      return 0;
    }
    puts("Library is not available.");
  }
  else {
    fwrite("\nusage: print_profile [-h]\n",0x1b,1,__s);
    fwrite("\t          print the current gate profile\n",0x2a,1,__s);
    fwrite("\t-h      : print the command usage\n",0x23,1,__s);
  }
  return 1;
}

Assistant:

int Mio_CommandPrintProfile( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pOut, * pErr;
    int fShort = 0;
    int fSelected = 0;
    int fVerbose = 0;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "savh")) != EOF ) 
    {
        switch (c) 
        {
            case 's':
                fShort ^= 1;
                break;
            case 'a':
                fSelected ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "Library is not available.\n" );
        return 1;
    }
    Mio_LibraryWriteProfile( stdout, (Mio_Library_t *)Abc_FrameReadLibGen() );
    return 0;

usage:
    fprintf( pErr, "\nusage: print_profile [-h]\n");
    fprintf( pErr, "\t          print the current gate profile\n" );  
    fprintf( pErr, "\t-h      : print the command usage\n");
    return 1;       
}